

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void expandFormatArguments<String,String,StringList>
               (vector<String,_std::allocator<String>_> *data,String *arg,String *rest,
               StringList *rest_1)

{
  string local_40 [32];
  
  std::__cxx11::string::string(local_40,(string *)arg);
  std::vector<String,_std::allocator<String>_>::push_back(data,(value_type *)local_40);
  std::__cxx11::string::~string(local_40);
  expandFormatArguments<String,StringList>(data,rest,rest_1);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}